

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

void replace_positional(string *fmt,string *from,string *to)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)fmt,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)fmt,uVar1,(string *)from->_M_string_length);
  }
  return;
}

Assistant:

static void replace_positional (
  std::string& fmt,
  const std::string& from,
  const std::string& to)
{
  std::string::size_type pos = 0;
  while ((pos = fmt.find (from, pos)) != std::string::npos)
  {
    fmt.replace (pos, from.length (), to);
    pos += to.length ();
  }
}